

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>_>
::bubbleDown(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>_>
             *this,uint index)

{
  Comparison CVar1;
  uint in_ESI;
  Binding *in_RDI;
  uint nextIndex;
  Binding *in_stack_ffffffffffffffd8;
  uint local_18;
  uint local_14;
  
  local_18 = in_ESI << 1;
  local_14 = in_ESI;
  do {
    if (in_RDI->var < local_18) {
      return local_14;
    }
    if ((local_18 == in_RDI->var) ||
       (CVar1 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                          (in_RDI,in_stack_ffffffffffffffd8), CVar1 != GREATER)) {
      CVar1 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                        (in_RDI,in_stack_ffffffffffffffd8);
      if (CVar1 != GREATER) {
        return local_14;
      }
      std::swap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Binding>
                ((Binding *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 0x10),
                 (Binding *)(*(long *)(in_RDI + 1) + (ulong)local_18 * 0x10));
    }
    else {
      CVar1 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                        (in_RDI,in_stack_ffffffffffffffd8);
      if (CVar1 == GREATER) {
        std::swap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Binding>
                  ((Binding *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 0x10),
                   (Binding *)(*(long *)(in_RDI + 1) + (ulong)local_18 * 0x10));
      }
      else {
        std::swap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Binding>
                  ((Binding *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 0x10),
                   (Binding *)(*(long *)(in_RDI + 1) + (ulong)(local_18 | 1) * 0x10));
        local_18 = local_18 | 1;
      }
    }
    local_14 = local_18;
    local_18 = local_18 << 1;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }